

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O0

void __thiscall iqnet::Reactor<boost::mutex>::Reactor(Reactor<boost::mutex> *this)

{
  Reactor<boost::mutex> *this_local;
  
  Reactor_base::Reactor_base(&this->super_Reactor_base);
  (this->super_Reactor_base)._vptr_Reactor_base = (_func_int **)&PTR__Reactor_002526c0;
  boost::mutex::mutex(&this->lock);
  Reactor_poll_impl::Reactor_poll_impl(&this->impl);
  std::
  map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
  ::map(&this->handlers);
  std::__cxx11::
  list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::list
            (&this->handlers_states);
  this->num_stoppers = 0;
  return;
}

Assistant:

Reactor<Lock>::Reactor():
  num_stoppers(0)
{
}